

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::block_is_load_bearing(CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppCVar3;
  byte local_31;
  value_type pCStack_20;
  bool breaking;
  CFGNode *merge_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  pCStack_20 = merge;
  while ((((sVar2 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::size(&pCStack_20->succ), sVar2 == 1 &&
           (bVar1 = merge_candidate_is_on_breaking_path(this,pCStack_20), bVar1)) &&
          (bVar1 = std::
                   vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                   ::empty(&(pCStack_20->ir).operations), !bVar1)) &&
         (bVar1 = block_is_control_dependent(pCStack_20), !bVar1))) {
    ppCVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::front(&pCStack_20->succ);
    pCStack_20 = *ppCVar3;
  }
  sVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size(&node->pred);
  local_31 = 0;
  if (1 < sVar2) {
    bVar1 = exists_path_in_cfg_without_intermediate_node
                      (this,node->immediate_dominator,pCStack_20,node);
    local_31 = bVar1 ^ 0xff;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool CFGStructurizer::block_is_load_bearing(const CFGNode *node, const CFGNode *merge) const
{
	while (merge->succ.size() == 1)
	{
		// If we're going to eliminate a block due to impossible merge,
		// we should look ahead since we might get a false positive.
		bool breaking = merge_candidate_is_on_breaking_path(merge);
		if (breaking && !merge->ir.operations.empty() && !block_is_control_dependent(merge))
			merge = merge->succ.front();
		else
			break;
	}

	return node->pred.size() >= 2 &&
	       !exists_path_in_cfg_without_intermediate_node(node->immediate_dominator, merge, node);
}